

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulation.c
# Opt level: O1

int simulateFluid(double **U,double **V,double **P,bndCond *bCond,lattice *grid,fluidSim *sim,
                 MPI_Comm Region,double t_end,char *problem,int opt)

{
  int iVar1;
  char **ppcVar2;
  double *buf1;
  double *pdVar3;
  double **ppdVar4;
  double **F;
  double **V_00;
  double dVar5;
  fluidSim *pfVar6;
  double dVar7;
  double **ppdVar8;
  ulong uVar9;
  double *pdVar10;
  int iVar11;
  double dVar12;
  double adStack_e0 [4];
  double *local_c0;
  undefined1 *local_b8;
  double local_b0;
  double dt;
  double *local_a0;
  double **local_98;
  double local_90;
  uint local_84;
  double **local_80;
  double **local_78;
  double **local_70;
  double **local_68;
  double local_60;
  fluidSim *local_58;
  double local_50;
  int local_44;
  double dStack_40;
  int rank;
  double delt;
  
  iVar11 = 0;
  if ((P != (double **)0x0 && (V != (double **)0x0 && U != (double **)0x0)) &&
     (sim != (fluidSim *)0x0 && (grid != (lattice *)0x0 && bCond != (bndCond *)0x0))) {
    adStack_e0[2] = 5.24062347462852e-318;
    dt = (double)bCond;
    local_58 = sim;
    local_50 = t_end;
    delt = (double)U;
    local_70 = create2Dfield(grid->deli + 1,grid->delj + 1);
    adStack_e0[2] = 5.24072722841415e-318;
    ppdVar8 = create2Dfield(grid->deli + 1,grid->delj + 1);
    adStack_e0[2] = 5.24080627891748e-318;
    local_98 = create2Dfield(grid->deli,grid->delj);
    iVar11 = 0;
    if (local_98 != (double **)0x0 && (ppdVar8 != (double **)0x0 && local_70 != (double **)0x0)) {
      adStack_e0[2] = 5.24116694683895e-318;
      local_80 = ppdVar8;
      local_78 = P;
      MPI_Comm_rank(Region,&local_44);
      local_b0 = 0.0;
      dStack_40 = local_58->dt;
      iVar11 = grid->deli;
      if (grid->deli < grid->delj) {
        iVar11 = grid->delj;
      }
      uVar9 = (ulong)(iVar11 + 3) * 8 + 0xf & 0xfffffffffffffff0;
      local_c0 = (double *)((long)adStack_e0 + (0x18 - uVar9));
      pdVar10 = (double *)((long)local_c0 - uVar9);
      if (opt < 0x10) {
        local_90 = local_50 + local_50;
      }
      else {
        local_90 = local_50 / (double)((uint)opt >> 4);
      }
      local_a0 = pdVar10;
      if (local_44 == 0) {
        dVar12 = local_58->Re;
        local_b8 = (undefined1 *)(adStack_e0 + 3);
        pdVar10[-1] = 5.24209579025313e-318;
        printf("Computing %s with Reynolds-number %lg.\n",dVar12,problem);
      }
      else {
        opt = opt & 0xfffffffe;
        local_b8 = (undefined1 *)(adStack_e0 + 3);
      }
      dVar12 = 4.94065645841247e-324;
      local_60 = 0.0;
      if (0.0 <= local_50) {
        dVar12 = 4.94065645841247e-324;
        local_84 = opt;
        local_68 = V;
        do {
          dVar5 = local_60;
          adStack_e0[3] = dVar12;
          if ((local_84 & 1) != 0) {
            pdVar10[-1] = 5.24249598342626e-318;
            printf("Time is at %lg seconds\n",dVar5);
          }
          dVar5 = delt;
          dVar12 = dt;
          pdVar10[-1] = 5.24263432180709e-318;
          setBCond((double **)dVar5,V,grid,(bndCond *)dVar12);
          dVar5 = delt;
          ppdVar8 = local_68;
          pdVar10[-1] = 5.2427281942798e-318;
          setSpecBCond((double **)dVar5,ppdVar8,grid,problem);
          dVar7 = delt;
          dVar5 = dStack_40;
          ppdVar8 = local_68;
          F = local_70;
          ppdVar4 = local_80;
          ppcVar2 = *(char ***)((long)dVar12 + 8);
          pdVar10[-2] = (double)local_58;
          pdVar10[-3] = 5.24297028644627e-318;
          compFG((double **)dVar7,ppdVar8,F,ppdVar4,ppcVar2,dVar5,grid,(fluidSim *)pdVar10[-2]);
          dVar5 = dStack_40;
          ppdVar8 = local_98;
          pdVar10[-1] = 5.24313332810939e-318;
          compRHS(F,ppdVar4,ppdVar8,grid,dVar5);
          pfVar6 = local_58;
          ppdVar4 = local_78;
          pdVar3 = local_a0;
          buf1 = local_c0;
          ppcVar2 = *(char ***)((long)dVar12 + 8);
          pdVar10[-1] = (double)Region;
          pdVar10[-2] = (double)grid;
          pdVar10[-3] = 5.24336553896294e-318;
          solveSORforPoisson(ppdVar4,ppdVar8,ppcVar2,buf1,pdVar3,pfVar6,(lattice *)pdVar10[-2],
                             (MPI_Comm)pdVar10[-1]);
          dVar5 = delt;
          dVar12 = dStack_40;
          V_00 = local_68;
          ppdVar8 = local_80;
          pdVar10[-2] = (double)*(undefined8 *)((long)dt + 8);
          dVar7 = delt;
          V = local_68;
          pdVar10[-3] = 5.24364715638107e-318;
          adaptUV((double **)dVar5,V_00,ppdVar4,F,ppdVar8,dVar12,grid,(char **)pdVar10[-2]);
          pdVar3 = local_a0;
          pdVar10[-2] = (double)Region;
          pdVar10[-3] = 5.24384972329586e-318;
          exchangeMat((double **)dVar7,2,1,buf1,pdVar3,grid,(MPI_Comm)pdVar10[-2]);
          pdVar10[-2] = (double)Region;
          pdVar10[-3] = 5.24403252758482e-318;
          exchangeMat(V,1,2,buf1,pdVar3,grid,(MPI_Comm)pdVar10[-2]);
          pfVar6 = local_58;
          pdVar10[-1] = 5.24417086596566e-318;
          local_b0 = compDelt(grid,(double **)dVar7,V,pfVar6);
          dVar5 = delt;
          ppdVar8 = local_78;
          iVar11 = SUB84(adStack_e0[3],0);
          dVar12 = adStack_e0[3];
          if ((double)iVar11 * local_90 < local_60) {
            pdVar10[-1] = 5.24449200863546e-318;
            dumpFields(Region,(double **)dVar5,V,ppdVar8,grid,iVar11 + -1);
            dVar12 = (double)(ulong)(iVar11 + 1);
          }
          pdVar10[-1] = 5.24469457555025e-318;
          MPI_Allreduce(&local_b0,&stack0xffffffffffffffc0,1,&ompi_mpi_double,&ompi_mpi_op_min,
                        Region);
          local_60 = local_60 + dStack_40;
          opt = local_84;
        } while (local_60 <= local_50);
      }
      dVar5 = delt;
      ppdVar8 = local_78;
      iVar11 = SUB84(dVar12,0);
      if (0xf < opt) {
        pdVar10[-1] = 5.24503054018942e-318;
        dumpFields(Region,(double **)dVar5,V,ppdVar8,grid,iVar11 + -1);
      }
      if (local_44 == 0) {
        pdVar10[-1] = 5.24511947200568e-318;
        puts("[Simulation complete!]");
      }
      ppdVar8 = local_70;
      iVar1 = grid->deli;
      pdVar10[-1] = 5.24519358185255e-318;
      destroy2Dfield(ppdVar8,iVar1 + 1);
      ppdVar8 = local_80;
      iVar1 = grid->deli;
      pdVar10[-1] = 5.24526769169943e-318;
      destroy2Dfield(ppdVar8,iVar1 + 1);
      ppdVar8 = local_98;
      iVar1 = grid->deli;
      pdVar10[-1] = 5.24534674220276e-318;
      destroy2Dfield(ppdVar8,iVar1);
    }
  }
  return iVar11;
}

Assistant:

int simulateFluid (REAL **U, REAL **V, REAL **P,
		bndCond* bCond, lattice *grid, fluidSim *sim, MPI_Comm Region,
		REAL t_end, const char *problem, int opt)
{
	/* Simulate the fluid characterized by sim, grid and bCond */
	/* Error checking */
	if (!U || !V|| !P)
		return 0;
	if (!bCond || !grid || !sim)
		return 0;
	/* Auxiliary Grids:
	   RHS is used for the Poisson-Solver so no ghost cells are neccessary */
	REAL **F = create2Dfield(grid->deli+1,grid->delj+1);
	REAL **G = create2Dfield(grid->deli+1,grid->delj+1);
	REAL **RHS = create2Dfield(grid->deli,grid->delj);
	if (!F || !G || !RHS)
		return 0;
	int n, rank;
	MPI_Comm_rank(Region,&rank);
	REAL del_vec, dt = 0, delt = sim->dt;

	n = grid->deli;
	if (grid->delj > n)
		n = grid->delj;
	REAL buf1[n+3], buf2[n+3];
	n = 1;
	if (opt >= OUTPUT)
		del_vec = t_end/(opt/OUTPUT);
	else
		del_vec = t_end*2;
	/* Begin the simulation */
	if (rank == 0)
		printf("Computing %s with Reynolds-number %lg.\n",problem,sim->Re);
	else
		opt -= opt&PRINT;
	for (REAL time = 0; time <= t_end; time += delt)
	{
		if (opt & PRINT)
			printf("Time is at %lg seconds\n",time);
		/* Update all parameters and fields for the iteration */
		setBCond(U,V,grid,bCond);
		setSpecBCond(U,V,grid,problem);
		compFG(U,V,F,G,bCond->FLAG,delt,grid,sim);
		compRHS(F,G,RHS,grid,delt);

		/* Solve the Poisson Equation */
		solveSORforPoisson(P,RHS,bCond->FLAG,buf1,buf2,sim,grid, Region);
		/* Update U and V through F,G and P */
		adaptUV(U,V,P,F,G,delt,grid,bCond->FLAG);
		exchangeMat(U,2,1,buf1,buf2,grid,Region);
		exchangeMat(V,1,2,buf1,buf2,grid,Region);
		dt = compDelt(grid,U,V,sim);

		if (time > del_vec*n)
		{
			dumpFields(Region,U,V,P,grid,n-1);
			n++;
		}
		MPI_Allreduce(&dt,&delt,1,MPI_DOUBLE,MPI_MIN,Region);
	}
	if (opt >= OUTPUT)
		dumpFields(Region,U,V,P,grid,n-1);
	if (rank == 0)
		printf("[Simulation complete!]\n");

	/* Destroy non-simulated grids */
	destroy2Dfield((void**)F,grid->deli+1);
	destroy2Dfield((void**)G,grid->deli+1);
	destroy2Dfield((void**)RHS,grid->deli);
	return n;
}